

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O3

void __thiscall cppnet::EpollEventActions::ProcessEvent(EpollEventActions *this,int32_t wait_ms)

{
  uint err;
  epoll_event *__events;
  int iVar1;
  uint *puVar2;
  pthread_t pVar3;
  SingletonLogger *pSVar4;
  char *pcVar5;
  
  __events = (epoll_event *)
             (this->_active_list).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
             _M_impl.super__Vector_impl_data._M_start;
  iVar1 = epoll_wait(this->_epoll_handler,__events,
                     (int)((ulong)((long)(this->_active_list).
                                         super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)__events
                                  ) >> 2) * -0x55555555,wait_ms);
  if (iVar1 << 0x10 != -0x10000) {
    pSVar4 = Singleton<cppnet::SingletonLogger>::Instance();
    pVar3 = pthread_self();
    SingletonLogger::Debug
              (pSVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
               ,0x11c,"EPOLL get events! num:%d, TheadId: %ld",
               (ulong)(uint)((iVar1 << 0x10) >> 0x10),pVar3);
    OnEvent(this,&this->_active_list,(int16_t)iVar1);
    return;
  }
  puVar2 = (uint *)__errno_location();
  if (*puVar2 == 4) {
    return;
  }
  pSVar4 = Singleton<cppnet::SingletonLogger>::Instance();
  err = *puVar2;
  pcVar5 = ErrnoInfo(err);
  SingletonLogger::Error
            (pSVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
             ,0x119,"EPOLL wait failed! error:%d, info:%s",(ulong)err,pcVar5);
  return;
}

Assistant:

void EpollEventActions::ProcessEvent(int32_t wait_ms) {
    int16_t ret = epoll_wait(_epoll_handler, &*_active_list.begin(), (int)_active_list.size(), wait_ms);
    if (ret == -1) {
        if (errno == EINTR) {
            return;
        }
        LOG_ERROR("EPOLL wait failed! error:%d, info:%s", errno, ErrnoInfo(errno));

    } else {
        LOG_DEBUG("EPOLL get events! num:%d, TheadId: %ld", ret, std::this_thread::get_id());

        OnEvent(_active_list, ret);
    }
}